

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O2

void __thiscall
VW::config::options_boost_po::
add_to_description_impl<VW::config::typelist<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (options_boost_po *this,shared_ptr<VW::config::base_option> *opt,
          options_description *options_description)

{
  bool bVar1;
  undefined4 extraout_EAX;
  undefined4 extraout_var;
  options_description *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  options_boost_po *this_00;
  shared_ptr<VW::config::base_option> opt_00;
  __shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  undefined1 local_38 [16];
  
  std::__shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_48,
             &opt->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>);
  bVar1 = add_if_t<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (this,(shared_ptr<VW::config::base_option> *)&_Stack_48,options_description);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  if (bVar1) {
    return;
  }
  this_00 = (options_boost_po *)local_38;
  std::__shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2> *)this_00,
             &opt->super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>);
  opt_00.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  opt_00.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)opt;
  add_to_description_impl<VW::config::typelist<>>(this_00,opt_00,in_RCX);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  _Unwind_Resume(CONCAT44(extraout_var,extraout_EAX));
}

Assistant:

void add_to_description_impl(std::shared_ptr<base_option> opt, po::options_description& options_description)
  {
    if (add_if_t<typename TTypes::head>(opt, options_description))
    {
      return;
    }
    add_to_description_impl<typename TTypes::tail>(opt, options_description);
  }